

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<argo::json,_std::default_delete<argo::json>_> __thiscall
argo::parser::parse(parser *this,istream *i)

{
  undefined1 local_2078 [8];
  parser p;
  stream_reader r;
  istream *i_local;
  
  stream_reader::stream_reader((stream_reader *)&p.m_convert_numbers,i,0xa00000,true);
  parser((parser *)local_2078,(reader *)&p.m_convert_numbers,true,0x19000,1000,true,true,true);
  parse(this);
  stream_reader::~stream_reader((stream_reader *)&p.m_convert_numbers);
  return (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
         (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)this;
}

Assistant:

unique_ptr<json> parser::parse(istream &i)
{
    stream_reader r(&i, max_message_length, true);
    parser p(r);
    return p.parse();
}